

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetisWriter.cc
# Opt level: O0

void writeMetisLine(ofstream *outputfile,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *neighbors)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  char *pcVar2;
  string *psVar3;
  ostream *this;
  allocator local_221;
  string local_220 [32];
  string local_200 [8];
  string untrimmed_neighbor_str;
  undefined1 local_1e0 [32];
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> local_1c0;
  ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *local_1b0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1a8;
  stringstream local_1a0 [8];
  stringstream node_list_stream;
  ostream_type local_190 [376];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *neighbors_local;
  ofstream *outputfile_local;
  
  local_18 = neighbors;
  neighbors_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)outputfile;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a8._M_current =
       (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(local_18);
  local_1b0 = (ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(local_18);
  std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::ostream_iterator
            (&local_1c0,local_190," ");
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_1e0,local_1a8,local_1b0);
  std::__cxx11::stringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,pcVar2,&local_221);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_220);
  pvVar1 = neighbors_local;
  psVar3 = rtrim((string *)local_200);
  this = std::operator<<((ostream *)pvVar1,(string *)psVar3);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void writeMetisLine(std::ofstream* outputfile,
            const std::vector<uint64_t>& neighbors) {
        std::stringstream node_list_stream;
        std::copy(neighbors.begin(),
                neighbors.end(),
                std::ostream_iterator<uint64_t>(node_list_stream, " "));
        std::string untrimmed_neighbor_str = node_list_stream.str().c_str();
        *outputfile << rtrim(&untrimmed_neighbor_str) << std::endl;
    }